

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  cs_detail *pcVar1;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  uint64_t *eflags;
  void *in_RDX;
  SStream *in_RSI;
  MCInst *in_RDI;
  MCRegisterInfo *unaff_retaddr;
  SStream *in_stack_00000008;
  MCInst *in_stack_00000010;
  uint8_t access [6];
  int i;
  cs_ac_type access2;
  cs_ac_type access1;
  x86_reg reg2;
  x86_reg reg;
  char *mnem;
  char *in_stack_ffffffffffffffa8;
  SStream *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 uVar7;
  undefined2 in_stack_ffffffffffffffc6;
  undefined2 uVar8;
  uint in_stack_ffffffffffffffcc;
  cs_ac_type in_stack_ffffffffffffffd0;
  cs_ac_type in_stack_ffffffffffffffd4;
  x86_reg local_28;
  x86_reg local_24;
  char *local_20;
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_RDI->assembly[0] == '\0') {
    if ((in_RDI->csh->mode == CS_MODE_64) && (uVar4 = MCInst_getOpcode(in_RDI), uVar4 == 0x169)) {
      SStream_concat0(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      MCInst_setOpcodePub(in_RDI,0x38);
      printPCRelImm((MCInst *)
                    CONCAT26(in_stack_ffffffffffffffc6,
                             CONCAT15(in_stack_ffffffffffffffc5,
                                      CONCAT14(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
                            ),uVar5,in_stack_ffffffffffffffb0);
    }
    else {
      local_20 = printAliasInstr(in_RDI,in_RSI,in_RDX);
      if (local_20 == (char *)0x0) {
        printInstruction(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      }
      else {
        (*cs_mem_free)(local_20);
      }
      if (in_RDI->flat_insn->id == 0x2b9) {
        SStream_Init(in_RSI);
        SStream_concat0(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      if ((in_RDI->has_imm & 1U) != 0) {
        if ((in_RDI->flat_insn->detail->field_6).x86.op_count < 2) {
          *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) = in_RDI->imm_size;
        }
        else if ((in_RDI->flat_insn->id != 0x9a) && (in_RDI->flat_insn->id != 0x9b)) {
          for (in_stack_ffffffffffffffcc = 0;
              (int)in_stack_ffffffffffffffcc <
              (int)(uint)(in_RDI->flat_insn->detail->field_6).x86.op_count;
              in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
            if (*(int *)(in_RDI->flat_insn->detail->groups +
                        (long)(int)in_stack_ffffffffffffffcc * 0x30 + 0x55) == 2) {
              in_RDI->flat_insn->detail->groups[(long)(int)in_stack_ffffffffffffffcc * 0x30 + 0x75]
                   = in_RDI->flat_insn->detail->groups
                     [(long)(int)((in_RDI->flat_insn->detail->field_6).x86.op_count - 1) * 0x30 +
                      0x75];
            }
          }
        }
      }
      if (in_RDI->csh->detail != CS_OPT_OFF) {
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        uVar5 = MCInst_getOpcode(in_RDI);
        eflags = (uint64_t *)(ulong)(uVar5 - 0x916);
        switch(eflags) {
        case (uint64_t *)0x0:
        case (uint64_t *)0x3:
        case (uint64_t *)0x6:
        case (uint64_t *)0x9:
        case (uint64_t *)0xc:
        case (uint64_t *)0xf:
        case (uint64_t *)0x12:
        case (uint64_t *)0x15:
        case (uint64_t *)0x20:
        case (uint64_t *)0x23:
        case (uint64_t *)0x26:
        case (uint64_t *)0x29:
        case (uint64_t *)0x2c:
        case (uint64_t *)0x2f:
        case (uint64_t *)0x32:
        case (uint64_t *)0x35:
        case (uint64_t *)0x79:
        case (uint64_t *)0x7c:
        case (uint64_t *)0x7f:
        case (uint64_t *)0x82:
        case (uint64_t *)0x85:
        case (uint64_t *)0x88:
        case (uint64_t *)0x8b:
        case (uint64_t *)0x8e:
        case (uint64_t *)0x91:
        case (uint64_t *)0x94:
        case (uint64_t *)0x97:
        case (uint64_t *)0x9a:
        case (uint64_t *)0x9d:
        case (uint64_t *)0xa0:
        case (uint64_t *)0xa3:
        case (uint64_t *)0xa6:
        case (uint64_t *)0xc1:
        case (uint64_t *)0xc4:
        case (uint64_t *)0xc7:
        case (uint64_t *)0xca:
        case (uint64_t *)0xcd:
        case (uint64_t *)0xd0:
        case (uint64_t *)0xd3:
        case (uint64_t *)0xd6:
        case (uint64_t *)0xda:
        case (uint64_t *)0xdd:
        case (uint64_t *)0xe0:
        case (uint64_t *)0xe3:
        case (uint64_t *)0xe6:
        case (uint64_t *)0xe9:
        case (uint64_t *)0xec:
        case (uint64_t *)0xef:
        case (uint64_t *)0x15e:
        case (uint64_t *)0x161:
        case (uint64_t *)0x164:
        case (uint64_t *)0x167:
        case (uint64_t *)0x16a:
        case (uint64_t *)0x16d:
        case (uint64_t *)0x170:
        case (uint64_t *)0x173:
        case (uint64_t *)0x186:
        case (uint64_t *)0x189:
        case (uint64_t *)0x18c:
        case (uint64_t *)0x18f:
        case (uint64_t *)0x192:
        case (uint64_t *)0x195:
        case (uint64_t *)0x198:
        case (uint64_t *)0x19b:
          memmove((void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x78),
                  (void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x48),0x150);
          (in_RDI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_IMM;
          paVar2 = &in_RDI->flat_insn->detail->field_6;
          ((cs_m68k_op *)paVar2)[1].mem.out_disp = 1;
          ((cs_m68k_op *)paVar2)[1].mem.disp = 0;
          ((cs_m68k_op *)paVar2)[1].mem.scale = '\0';
          ((cs_m68k_op *)paVar2)[1].mem.bitfield = '\0';
          *(undefined1 *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) = 1;
          pcVar1 = in_RDI->flat_insn->detail;
          (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
          break;
        default:
        }
        uVar5 = MCInst_getOpcode(in_RDI);
        local_24 = X86_insn_reg_att(uVar5,(cs_ac_type *)&stack0xffffffffffffffd4);
        if (local_24 == X86_REG_INVALID) {
          uVar5 = MCInst_getOpcode(in_RDI);
          _Var3 = X86_insn_reg_att2(uVar5,&local_24,(cs_ac_type *)&stack0xffffffffffffffd4,&local_28
                                    ,(cs_ac_type *)&stack0xffffffffffffffd0);
          if (_Var3) {
            (in_RDI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
            (in_RDI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_24;
            *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) =
                 in_RDI->csh->regsize_map[local_24];
            *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) =
                 (char)in_stack_ffffffffffffffd4;
            (in_RDI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
            (in_RDI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_28;
            *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x98) =
                 in_RDI->csh->regsize_map[local_28];
            *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) =
                 (char)in_stack_ffffffffffffffd0;
            (in_RDI->flat_insn->detail->field_6).x86.op_count = '\x02';
          }
        }
        else {
          memmove((void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x78),
                  (void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x48),0x150);
          (in_RDI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
          (in_RDI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_24;
          *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) =
               in_RDI->csh->regsize_map[local_24];
          *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) =
               (char)in_stack_ffffffffffffffd4;
          pcVar1 = in_RDI->flat_insn->detail;
          (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
        }
        MCInst_getOpcode(in_RDI);
        get_op_access((cs_struct *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc,
                      (uint8_t *)
                      CONCAT26(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,in_stack_ffffffffffffffc0))),
                      eflags);
        *(undefined1 *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) = uVar6;
        *(undefined1 *)((long)&in_RDI->flat_insn->detail->field_6 + 0x99) = uVar7;
      }
    }
  }
  else {
    strncpy(in_RSI->buffer,in_RDI->assembly,0x200);
  }
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;
	int i;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(OS->buffer, MI->assembly, sizeof(OS->buffer));
		return;
	}

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	// HACK TODO: fix this in machine description
	switch(MI->flat_insn->id) {
		default: break;
		case X86_INS_SYSEXIT:
				 SStream_Init(OS);
				 SStream_concat0(OS, "sysexit");
				 break;
	}

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
				for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
					if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
						MI->flat_insn->detail->x86.operands[i].size =
							MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
				}
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
		uint8_t access[6] = {0};

		// some instructions need to supply immediate 1 in the first op
		switch(MCInst_getOpcode(MI)) {
			default:
				break;
			case X86_SHL8r1:
			case X86_SHL16r1:
			case X86_SHL32r1:
			case X86_SHL64r1:
			case X86_SAL8r1:
			case X86_SAL16r1:
			case X86_SAL32r1:
			case X86_SAL64r1:
			case X86_SHR8r1:
			case X86_SHR16r1:
			case X86_SHR32r1:
			case X86_SHR64r1:
			case X86_SAR8r1:
			case X86_SAR16r1:
			case X86_SAR32r1:
			case X86_SAR64r1:
			case X86_RCL8r1:
			case X86_RCL16r1:
			case X86_RCL32r1:
			case X86_RCL64r1:
			case X86_RCR8r1:
			case X86_RCR16r1:
			case X86_RCR32r1:
			case X86_RCR64r1:
			case X86_ROL8r1:
			case X86_ROL16r1:
			case X86_ROL32r1:
			case X86_ROL64r1:
			case X86_ROR8r1:
			case X86_ROR16r1:
			case X86_ROR32r1:
			case X86_ROR64r1:
			case X86_SHL8m1:
			case X86_SHL16m1:
			case X86_SHL32m1:
			case X86_SHL64m1:
			case X86_SAL8m1:
			case X86_SAL16m1:
			case X86_SAL32m1:
			case X86_SAL64m1:
			case X86_SHR8m1:
			case X86_SHR16m1:
			case X86_SHR32m1:
			case X86_SHR64m1:
			case X86_SAR8m1:
			case X86_SAR16m1:
			case X86_SAR32m1:
			case X86_SAR64m1:
			case X86_RCL8m1:
			case X86_RCL16m1:
			case X86_RCL32m1:
			case X86_RCL64m1:
			case X86_RCR8m1:
			case X86_RCR16m1:
			case X86_RCR32m1:
			case X86_RCR64m1:
			case X86_ROL8m1:
			case X86_ROL16m1:
			case X86_ROL32m1:
			case X86_ROL64m1:
			case X86_ROR8m1:
			case X86_ROR16m1:
			case X86_ROR32m1:
			case X86_ROR64m1:
				// shift all the ops right to leave 1st slot for this new register op
				memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
						sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_IMM;
				MI->flat_insn->detail->x86.operands[0].imm = 1;
				MI->flat_insn->detail->x86.operands[0].size = 1;
				MI->flat_insn->detail->x86.op_count++;
		}

		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand

		//printf(">>> opcode = %u\n", MCInst_getOpcode(MI));

		reg = X86_insn_reg_att(MCInst_getOpcode(MI), &access1);
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;

			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {

				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[0].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}
}